

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::
int_writer<unsigned__int128,fmt::v6::basic_format_specs<char>>::dec_writer::operator()
          (dec_writer *this,char **it)

{
  char *pcVar1;
  
  pcVar1 = format_decimal<char,unsigned__int128,char*,fmt::v6::internal::format_decimal<char,char*,unsigned__int128>(char*,unsigned__int128,int)::_lambda(char*)_1_>
                     (*it,*(undefined8 *)this,*(undefined8 *)(this + 8),*(undefined4 *)(this + 0x10)
                     );
  *it = pcVar1;
  return;
}

Assistant:

void operator()(It&& it) const {
        it = internal::format_decimal<char_type>(it, abs_value, num_digits);
      }